

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitIf(PrintExpressionContents *this,If *curr)

{
  ostream *o;
  bool bVar1;
  bool bVar2;
  Type local_68;
  Signature local_60;
  uintptr_t local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  BasicType local_34;
  Type local_30;
  Type type;
  If *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&type,"if");
  printMedium(o,_type);
  local_30.id = (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
  local_34 = unreachable;
  bVar1 = wasm::Type::operator==(&curr->condition->type,&local_34);
  bVar2 = false;
  if (bVar1) {
    bVar2 = curr->ifFalse != (Expression *)0x0;
  }
  if (bVar2) {
    local_48 = (curr->ifTrue->type).id;
    local_50 = (curr->ifFalse->type).id;
    local_40 = (uintptr_t)wasm::Type::getLeastUpperBound((Type)local_48,(Type)local_50);
    local_30 = (Type)local_40;
  }
  bVar2 = wasm::Type::isConcrete(&local_30);
  if (bVar2) {
    std::operator<<(this->o,' ');
    wasm::Type::Type(&local_68,none);
    Signature::Signature(&local_60,local_68,local_30);
    printBlockType(this,local_60);
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    printMedium(o, "if");
    // Ifs are unreachable if their condition is unreachable, but in that case
    // the arms might have some concrete type we have to account for to produce
    // valid wat.
    auto type = curr->type;
    if (curr->condition->type == Type::unreachable && curr->ifFalse) {
      type = Type::getLeastUpperBound(curr->ifTrue->type, curr->ifFalse->type);
    }
    if (type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, type));
    }
  }